

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
Liby::Buffer::retriveveAsVector
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Buffer *this,off_t len)

{
  off_t oVar1;
  allocator_type local_19;
  
  if (len < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0x106,"std::vector<char> Liby::Buffer::retriveveAsVector(off_t)");
  }
  if ((len != 0) && (oVar1 = size(this), len <= oVar1)) {
    std::vector<char,std::allocator<char>>::vector<char*,void>
              ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
               this->buffer_ + this->leftIndex_,this->buffer_ + this->rightIndex_,&local_19);
    retrieve(this,len);
    return __return_storage_ptr__;
  }
  retriveveAllAsVector(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> Buffer::retriveveAsVector(off_t len) {
    assert(len >= 0);
    if (len == 0 || len > size())
        return retriveveAllAsVector();
    std::vector<char> ret(&buffer_[leftIndex_], &buffer_[rightIndex_]);
    retrieve(len);
    return ret;
}